

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O0

void __thiscall Blob_Detection::BlobInfo::_getLength(BlobInfo *this)

{
  bool bVar1;
  long in_RDI;
  double dVar2;
  PointBase2D<unsigned_int> endPoint;
  PointBase2D<unsigned_int> startPoint;
  PointBase2D<unsigned_int> *in_stack_00000030;
  PointBase2D<unsigned_int> *in_stack_00000038;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000040;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000048;
  PointBase2D<unsigned_int> local_18;
  PointBase2D<unsigned_int> in_stack_fffffffffffffff0;
  
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffff0);
  if (!bVar1) {
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffff0);
    if ((!bVar1) && ((*(byte *)(in_RDI + 0xf0) & 1) == 0)) {
      PointBase2D<unsigned_int>::PointBase2D
                ((PointBase2D<unsigned_int> *)&stack0xfffffffffffffff0,0,0);
      PointBase2D<unsigned_int>::PointBase2D(&local_18,0,0);
      dVar2 = anon_unknown.dwarf_19ba7::getLengthFromCountour
                        (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
      *(double *)(in_RDI + 0xe8) = dVar2;
      *(undefined1 *)(in_RDI + 0xf0) = 1;
    }
  }
  return;
}

Assistant:

void BlobInfo::_getLength()
    {
        if( !_contourX.empty() && !_contourY.empty() && !_length.found ) {
            PointBase2D< uint32_t > startPoint;
            PointBase2D< uint32_t > endPoint;
            _length.value = getLengthFromCountour( _contourX, _contourY, startPoint, endPoint );

            _length.found = true;
        }
    }